

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O0

double __thiscall NJamSpell::TLangModel::Score(TLangModel *this,wstring *str)

{
  pointer *this_00;
  bool bVar1;
  reference this_01;
  reference __x;
  double dVar2;
  TWord *w;
  iterator __end2;
  iterator __begin2;
  vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *__range2;
  vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *s;
  iterator __end1;
  iterator __begin1;
  TSentences *__range1;
  TWords words;
  TSentences sentences;
  wstring *str_local;
  TLangModel *this_local;
  
  TTokenizer::Process((TSentences *)
                      &words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->Tokenizer,str);
  std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector
            ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&__range1);
  this_00 = &words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __end1 = std::
           vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
           ::begin((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                    *)this_00);
  s = (vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
      std::
      vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ::end((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_*,_std::vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>_>
                                *)&s);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_*,_std::vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>_>
              ::operator*(&__end1);
    __end2 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::begin(this_01);
    w = (TWord *)std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::end(this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<NJamSpell::TWord_*,_std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>
                                  *)&w);
      if (!bVar1) break;
      __x = __gnu_cxx::
            __normal_iterator<NJamSpell::TWord_*,_std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>
            ::operator*(&__end2);
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&__range1,__x);
      __gnu_cxx::
      __normal_iterator<NJamSpell::TWord_*,_std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_*,_std::vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>_>
    ::operator++(&__end1);
  }
  dVar2 = Score(this,(TWords *)&__range1);
  std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
            ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&__range1);
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)&words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  return dVar2;
}

Assistant:

double TLangModel::Score(const std::wstring& str) const {
    TSentences sentences = Tokenizer.Process(str);
    TWords words;
    for (auto&& s: sentences) {
        for (auto&& w: s) {
            words.push_back(w);
        }
    }
    return Score(words);
}